

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prwlock-posix.c
# Opt level: O2

pboolean pp_rwlock_unlock_any(PRWLock *lock)

{
  int iVar1;
  pboolean pVar2;
  
  if (lock == (PRWLock *)0x0) {
    pVar2 = 0;
  }
  else {
    iVar1 = pthread_rwlock_unlock((pthread_rwlock_t *)lock);
    if (iVar1 == 0) {
      pVar2 = 1;
    }
    else {
      pVar2 = 0;
      printf("** Error: %s **\n","PRWLock::pp_rwlock_unlock_any: pthread_rwlock_unlock() failed");
    }
  }
  return pVar2;
}

Assistant:

static pboolean
pp_rwlock_unlock_any (PRWLock *lock)
{
	if (P_UNLIKELY (lock == NULL))
		return FALSE;

	if (P_LIKELY (pthread_rwlock_unlock (&lock->hdl) == 0))
		return TRUE;
	else {
		P_ERROR ("PRWLock::pp_rwlock_unlock_any: pthread_rwlock_unlock() failed");
		return FALSE;
	}
}